

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_debug_ostream.h
# Opt level: O3

void __thiscall WifiDebugOstream::onechar(WifiDebugOstream *this,char c)

{
  char cVar1;
  char local_19;
  
  local_19 = c;
  (**this->m_serialDebug->_vptr_DebugInterface)(this->m_serialDebug,&local_19,1);
  cVar1 = local_19;
  if (this->m_lastWasNewline == true && local_19 != '\n') {
    (*this->m_wifiDebug->_vptr_NetInterface[4])(this->m_wifiDebug,"# ",2);
  }
  (*this->m_wifiDebug->_vptr_NetInterface[4])(this->m_wifiDebug,&local_19,1);
  this->m_lastWasNewline = cVar1 == '\n';
  return;
}

Assistant:

void onechar(char c )
  { 
    m_serialDebug->write( &c, 1 );
    bool isNewLine = ( c == '\n' );
    if ( m_lastWasNewline && !isNewLine )
    {
      (*m_wifiDebug) << "# ";
    }
    m_wifiDebug->write( &c, 1 );
    m_lastWasNewline = isNewLine;
  }